

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

void Sbd_StoComputeCutsTest(Gia_Man_t *pGia)

{
  uint uVar1;
  Sbd_Sto_t *p;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  int level;
  int iVar4;
  long lVar5;
  long lVar6;
  timespec ts;
  timespec local_28;
  
  iVar4 = 0;
  p = Sbd_StoAlloc(pGia,(Vec_Int_t *)0x0,4,8,100,1,1);
  pGVar2 = p->pGia;
  if (0 < pGVar2->nObjs) {
    do {
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) break;
      Sbd_StoRefObj(p,iVar4,-1);
      iVar4 = iVar4 + 1;
      pGVar2 = p->pGia;
    } while (iVar4 < pGVar2->nObjs);
  }
  Sbd_StoComputeCutsConst0(p,0);
  pGVar2 = p->pGia;
  pVVar3 = pGVar2->vCis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      iVar4 = pVVar3->pArray[lVar5];
      if ((iVar4 < 0) || (pGVar2->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar4 == 0) break;
      Sbd_StoComputeCutsCi(p,iVar4,0,0);
      lVar5 = lVar5 + 1;
      pGVar2 = p->pGia;
      pVVar3 = pGVar2->vCis;
    } while (lVar5 < pVVar3->nSize);
  }
  pGVar2 = p->pGia;
  if (0 < pGVar2->nObjs) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      if (pGVar2->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(&pGVar2->pObjs->field_0x0 + lVar6);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        Sbd_StoComputeCutsNode(p,(int)lVar5);
      }
      lVar5 = lVar5 + 1;
      pGVar2 = p->pGia;
      lVar6 = lVar6 + 0xc;
    } while (lVar5 < pGVar2->nObjs);
  }
  if (p->fVerbose != 0) {
    printf("Running cut computation with LutSize = %d  CutSize = %d  CutNum = %d:\n",
           (ulong)(uint)p->nLutSize,(ulong)(uint)p->nCutSize,(ulong)(uint)p->nCutNum);
    printf("CutPair = %.0f  ",p->CutCount[0]);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    pGVar2 = p->pGia;
    printf("Cut/Node = %.2f  ",
           p->CutCount[3] / (double)(~(pGVar2->vCos->nSize + pGVar2->vCis->nSize) + pGVar2->nObjs));
    putchar(10);
    printf("Spec = %4d  ",(ulong)(uint)p->nCutsSpec);
    printf("Over = %4d  ",(ulong)(uint)p->nCutsOver);
    printf("Lev = %4d  ",(ulong)(uint)p->DelayMin);
    level = 3;
    iVar4 = clock_gettime(3,&local_28);
    if (iVar4 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    lVar6 = p->clkStart;
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 - lVar6) / 1000000.0);
  }
  Sbd_StoFree(p);
  return;
}

Assistant:

void Sbd_StoComputeCutsTest( Gia_Man_t * pGia )
{
    Sbd_Sto_t * p = Sbd_StoAlloc( pGia, NULL, 4, 8, 100, 1, 1 );
    Gia_Obj_t * pObj;   
    int i, iObj;
    // prepare references
    Gia_ManForEachObj( p->pGia, pObj, iObj )
        Sbd_StoRefObj( p, iObj, -1 );
    // compute cuts
    Sbd_StoComputeCutsConst0( p, 0 );
    Gia_ManForEachCiId( p->pGia, iObj, i )
        Sbd_StoComputeCutsCi( p, iObj, 0, 0 );
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
        Sbd_StoComputeCutsNode( p, iObj );
    if ( p->fVerbose )
    {
        printf( "Running cut computation with LutSize = %d  CutSize = %d  CutNum = %d:\n", p->nLutSize, p->nCutSize, p->nCutNum );
        printf( "CutPair = %.0f  ",         p->CutCount[0] );
        printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
        printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
        printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
        printf( "Cut/Node = %.2f  ",        p->CutCount[3] / Gia_ManAndNum(p->pGia) );
        printf( "\n" );
        printf( "Spec = %4d  ",             p->nCutsSpec );
        printf( "Over = %4d  ",             p->nCutsOver );
        printf( "Lev = %4d  ",              p->DelayMin );
        Abc_PrintTime( 0, "Time", Abc_Clock() - p->clkStart );
    }
    Sbd_StoFree( p );
}